

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O2

void replace(char **tmp,wchar_t c)

{
  char *__s;
  char *pcVar1;
  
  __s = *tmp;
  pcVar1 = strrchr(__s,c);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strdup(pcVar1 + 1);
    free(__s);
    *tmp = pcVar1;
  }
  return;
}

Assistant:

static void
replace(char **tmp, int c)
{
	char *aptr;
	if ((aptr = strrchr(*tmp, c)) == NULL)
		return;
	aptr = strdup(aptr + 1); // XXX: check
	el_free(*tmp);
	*tmp = aptr;
}